

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O0

void dfs(int u)

{
  bool bVar1;
  reference this;
  reference piVar2;
  reference local_50;
  int local_3c;
  iterator iStack_38;
  int i;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  int local_c [2];
  int u_local;
  
  local_c[0] = u;
  ___range1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,
                         (long)u);
  std::_Bit_reference::operator=((_Bit_reference *)&__range1,true);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::comp,local_c);
  this = std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::operator[](&edge,(long)local_c[0]);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_3c = *piVar2;
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,
                          (long)local_3c);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      dfs(local_3c);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void dfs(int u) {
    useddfs[u] = true;
    comp.push_back(u);
    for (int i : edge[u])
        if (!useddfs[i])
            dfs(i);
}